

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O1

void __thiscall leveldb::Benchmark::Run(Benchmark *this)

{
  size_t __n;
  int iVar1;
  char *pcVar2;
  DBState state;
  Order order;
  bool write_sync;
  int value_size;
  char *__s;
  int entries_per_batch;
  Slice local_60 [3];
  
  PrintHeader(this);
  Open(this);
  if (FLAGS_benchmarks != (char *)0x0) {
    __s = FLAGS_benchmarks;
    do {
      pcVar2 = strchr(__s,0x2c);
      local_60[0].data_ = "";
      local_60[0].size_ = 0;
      if (pcVar2 == (char *)0x0) {
        local_60[0].size_ = strlen(__s);
        pcVar2 = (char *)0x0;
      }
      else {
        local_60[0].size_ = (long)pcVar2 - (long)__s;
        pcVar2 = pcVar2 + 1;
      }
      this->bytes_ = 0;
      local_60[0].data_ = __s;
      Start(this);
      __n = local_60[0].size_;
      switch(local_60[0].size_) {
      case 0:
        goto switchD_00106008_caseD_0;
      case 7:
        iVar1 = bcmp(local_60[0].data_,"fillseq",local_60[0].size_);
        if (iVar1 == 0) {
          iVar1 = this->num_;
          entries_per_batch = 1;
          goto LAB_00106359;
        }
        switch(__n) {
        case 0:
          goto switchD_00106008_caseD_0;
        case 7:
          goto switchD_00106150_caseD_7;
        case 9:
          goto switchD_00106008_caseD_9;
        case 10:
          goto switchD_00106008_caseD_a;
        case 0xb:
          goto switchD_00106008_caseD_b;
        case 0xc:
          goto switchD_00106008_caseD_c;
        case 0xd:
          goto switchD_00106008_caseD_d;
        case 0xe:
          goto switchD_00106008_caseD_e;
        }
        break;
      case 9:
switchD_00106008_caseD_9:
        iVar1 = bcmp(local_60[0].data_,"overwrite",__n);
        if (iVar1 == 0) {
          iVar1 = this->num_;
          entries_per_batch = 1;
          goto LAB_001062c9;
        }
        switch(__n) {
        case 0:
          goto switchD_00106008_caseD_0;
        case 7:
          goto switchD_00106150_caseD_7;
        case 10:
          goto switchD_00106150_caseD_a;
        case 0xb:
          goto switchD_00106008_caseD_b;
        case 0xc:
          goto switchD_00106150_caseD_c;
        case 0xe:
          goto switchD_00106008_caseD_e;
        }
        break;
      case 10:
switchD_00106008_caseD_a:
        iVar1 = bcmp(local_60[0].data_,"fillrandom",__n);
        if (iVar1 == 0) {
          iVar1 = this->num_;
          entries_per_batch = 1;
          goto LAB_00106303;
        }
        switch(__n) {
        case 0:
          goto switchD_00106008_caseD_0;
        case 7:
          goto switchD_00106150_caseD_7;
        case 9:
          goto switchD_00106008_caseD_9;
        case 10:
          goto switchD_00106150_caseD_a;
        case 0xb:
          goto switchD_00106008_caseD_b;
        case 0xc:
          goto switchD_00106150_caseD_c;
        case 0xd:
          goto switchD_00106008_caseD_d;
        case 0xe:
          goto switchD_00106008_caseD_e;
        }
        break;
      case 0xb:
switchD_00106008_caseD_b:
        iVar1 = bcmp(local_60[0].data_,"fillseqsync",__n);
        if (iVar1 == 0) {
          iVar1 = this->num_;
          order = SEQUENTIAL;
LAB_00106446:
          iVar1 = iVar1 / 100;
          entries_per_batch = 1;
          write_sync = true;
          state = FRESH;
          value_size = FLAGS_value_size;
LAB_00106448:
          Write(this,write_sync,order,state,iVar1,value_size,entries_per_batch);
          if (FLAGS_WAL_enabled == true) {
            sqlite3_wal_checkpoint_v2(this->db_,0,1,0,0);
          }
LAB_0010646a:
          Stop(this,local_60);
          goto LAB_00106475;
        }
        switch(__n) {
        case 7:
switchD_00106150_caseD_7:
          iVar1 = bcmp(local_60[0].data_,"readseq",__n);
          if (iVar1 == 0) {
            ReadSequential(this);
            goto LAB_0010646a;
          }
          if (__n == 0) goto switchD_00106008_caseD_0;
          if (__n == 0xc) goto switchD_0010639f_caseD_c;
          if (__n == 10) goto switchD_00106150_caseD_a;
          break;
        case 8:
        case 9:
          break;
        case 10:
switchD_00106150_caseD_a:
          iVar1 = bcmp(local_60[0].data_,"readrandom",__n);
          if (iVar1 == 0) {
            Read(this,RANDOM,1);
            goto LAB_0010646a;
          }
          if (__n == 0) goto switchD_00106008_caseD_0;
LAB_00106214:
          if (__n == 0xc) goto switchD_0010639f_caseD_c;
          break;
        case 0xb:
switchD_001061c4_caseD_b:
          iVar1 = bcmp(local_60[0].data_,"fillseq100K",__n);
          if (iVar1 == 0) {
            iVar1 = this->num_;
            order = SEQUENTIAL;
LAB_001064d3:
            iVar1 = iVar1 / 1000;
            entries_per_batch = 1;
            write_sync = false;
            state = FRESH;
            value_size = 100000;
            goto LAB_00106448;
          }
          if (9 < (long)__n) {
            if (__n == 10) goto switchD_00106150_caseD_a;
            goto LAB_00106214;
          }
          if (__n == 0) goto switchD_00106008_caseD_0;
          if (__n == 7) goto switchD_00106150_caseD_7;
          break;
        case 0xc:
switchD_001061c4_caseD_c:
          iVar1 = bcmp(local_60[0].data_,"fillrand100K",__n);
          if (iVar1 == 0) {
            iVar1 = this->num_;
            order = RANDOM;
            goto LAB_001064d3;
          }
          switch(__n) {
          case 7:
            goto switchD_00106150_caseD_7;
          case 8:
          case 9:
            goto switchD_00106008_caseD_1;
          case 10:
            goto switchD_00106150_caseD_a;
          case 0xb:
            goto switchD_001061c4_caseD_b;
          case 0xc:
switchD_0010639f_caseD_c:
            iVar1 = bcmp(local_60[0].data_,"readrand100K",__n);
            if (iVar1 == 0) {
              iVar1 = this->reads_;
              this->reads_ = iVar1 / 1000;
              Read(this,RANDOM,1);
              this->reads_ = iVar1;
              goto LAB_0010646a;
            }
          }
        default:
switchD_00106150_default:
          if (__n != 0) break;
switchD_00106008_caseD_0:
          iVar1 = bcmp(local_60[0].data_,"",__n);
          if (iVar1 != 0) break;
          goto LAB_00106475;
        }
        break;
      case 0xc:
switchD_00106008_caseD_c:
        iVar1 = bcmp(local_60[0].data_,"fillseqbatch",__n);
        if (iVar1 == 0) {
          iVar1 = this->num_;
          entries_per_batch = 1000;
LAB_00106359:
          order = SEQUENTIAL;
          goto LAB_00106360;
        }
        switch(__n) {
        case 0:
          goto switchD_00106008_caseD_0;
        case 7:
          goto switchD_00106150_caseD_7;
        case 9:
          goto switchD_00106008_caseD_9;
        case 10:
          goto switchD_00106008_caseD_a;
        case 0xb:
          goto switchD_00106008_caseD_b;
        case 0xc:
          goto switchD_00106150_caseD_c;
        case 0xd:
          goto switchD_00106008_caseD_d;
        case 0xe:
          goto switchD_00106008_caseD_e;
        }
        break;
      case 0xd:
switchD_00106008_caseD_d:
        iVar1 = bcmp(local_60[0].data_,"fillrandbatch",__n);
        if (iVar1 == 0) {
          iVar1 = this->num_;
          entries_per_batch = 1000;
LAB_00106303:
          order = RANDOM;
LAB_00106360:
          write_sync = false;
          state = FRESH;
          value_size = FLAGS_value_size;
          goto LAB_00106448;
        }
        switch(__n) {
        case 0:
          goto switchD_00106008_caseD_0;
        case 7:
          goto switchD_00106150_caseD_7;
        case 9:
          goto switchD_00106008_caseD_9;
        case 10:
          goto switchD_00106150_caseD_a;
        case 0xb:
          goto switchD_00106008_caseD_b;
        case 0xc:
          goto switchD_00106150_caseD_c;
        case 0xe:
          goto switchD_00106008_caseD_e;
        }
        break;
      case 0xe:
switchD_00106008_caseD_e:
        iVar1 = bcmp(local_60[0].data_,"overwritebatch",__n);
        if (iVar1 != 0) {
          switch(__n) {
          case 7:
            goto switchD_00106150_caseD_7;
          case 8:
          case 9:
            goto switchD_00106008_caseD_1;
          case 10:
            goto switchD_00106150_caseD_a;
          case 0xb:
            goto switchD_00106008_caseD_b;
          case 0xc:
switchD_00106150_caseD_c:
            iVar1 = bcmp(local_60[0].data_,"fillrandsync",__n);
            if (iVar1 != 0) {
              switch(__n) {
              case 7:
                goto switchD_00106150_caseD_7;
              case 8:
              case 9:
                goto switchD_00106008_caseD_1;
              case 10:
                goto switchD_00106150_caseD_a;
              case 0xb:
                goto switchD_00106008_caseD_b;
              case 0xc:
                goto switchD_001061c4_caseD_c;
              default:
                goto switchD_00106150_default;
              }
            }
            iVar1 = this->num_;
            order = RANDOM;
            goto LAB_00106446;
          default:
            goto switchD_00106150_default;
          }
        }
        iVar1 = this->num_;
        entries_per_batch = 1000;
LAB_001062c9:
        write_sync = false;
        order = RANDOM;
        state = EXISTING;
        value_size = FLAGS_value_size;
        goto LAB_00106448;
      }
switchD_00106008_caseD_1:
      Run();
LAB_00106475:
      __s = pcVar2;
    } while (pcVar2 != (char *)0x0);
  }
  return;
}

Assistant:

void Run() {
    PrintHeader();
    Open();

    const char* benchmarks = FLAGS_benchmarks;
    while (benchmarks != nullptr) {
      const char* sep = strchr(benchmarks, ',');
      Slice name;
      if (sep == nullptr) {
        name = benchmarks;
        benchmarks = nullptr;
      } else {
        name = Slice(benchmarks, sep - benchmarks);
        benchmarks = sep + 1;
      }

      bytes_ = 0;
      Start();

      bool known = true;
      bool write_sync = false;
      if (name == Slice("fillseq")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseqbatch")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandom")) {
        Write(write_sync, RANDOM, FRESH, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandbatch")) {
        Write(write_sync, RANDOM, FRESH, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("overwrite")) {
        Write(write_sync, RANDOM, EXISTING, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("overwritebatch")) {
        Write(write_sync, RANDOM, EXISTING, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandsync")) {
        write_sync = true;
        Write(write_sync, RANDOM, FRESH, num_ / 100, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseqsync")) {
        write_sync = true;
        Write(write_sync, SEQUENTIAL, FRESH, num_ / 100, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrand100K")) {
        Write(write_sync, RANDOM, FRESH, num_ / 1000, 100 * 1000, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseq100K")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_ / 1000, 100 * 1000, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("readseq")) {
        ReadSequential();
      } else if (name == Slice("readrandom")) {
        Read(RANDOM, 1);
      } else if (name == Slice("readrand100K")) {
        int n = reads_;
        reads_ /= 1000;
        Read(RANDOM, 1);
        reads_ = n;
      } else {
        known = false;
        if (name != Slice()) {  // No error message for empty name
          std::fprintf(stderr, "unknown benchmark '%s'\n",
                       name.ToString().c_str());
        }
      }
      if (known) {
        Stop(name);
      }
    }
  }